

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_start.c
# Opt level: O0

void * thread_socket(void *p)

{
  int iVar1;
  int r;
  monitor *m;
  void *p_local;
  
  skynet_initthread(2);
  do {
    while( true ) {
      iVar1 = skynet_socket_poll();
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      if (iVar1 < 0) break;
      wakeup((monitor *)p,0);
    }
    iVar1 = skynet_context_total();
  } while (iVar1 != 0);
  return (void *)0x0;
}

Assistant:

static void *
thread_socket(void *p) {
	struct monitor * m = p;
	skynet_initthread(THREAD_SOCKET);
	for (;;) {
		int r = skynet_socket_poll();
		if (r==0)
			break;
		if (r<0) {
			CHECK_ABORT
			continue;
		}
		wakeup(m,0);
	}
	return NULL;
}